

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O2

void __thiscall
ncnn::ConvolutionDepthWise_x86::ConvolutionDepthWise_x86(ConvolutionDepthWise_x86 *this)

{
  ConvolutionDepthWise::ConvolutionDepthWise((ConvolutionDepthWise *)&this->field_0xb8);
  this->_vptr_ConvolutionDepthWise_x86 = (_func_int **)0x333798;
  *(undefined8 *)&this->field_0xb8 = 0x333820;
  (this->weight_data_packed).allocator = (Allocator *)0x0;
  (this->weight_data_packed).dims = 0;
  (this->weight_data_packed).w = 0;
  (this->weight_data_packed).w = 0;
  (this->weight_data_packed).h = 0;
  (this->weight_data_packed).d = 0;
  (this->weight_data_packed).c = 0;
  (this->weight_data_int8).cstep = 0;
  (this->weight_data_int8).allocator = (Allocator *)0x0;
  (this->weight_data_int8).dims = 0;
  (this->weight_data_int8).w = 0;
  (this->weight_data_int8).w = 0;
  (this->weight_data_int8).h = 0;
  (this->weight_data_int8).d = 0;
  (this->weight_data_int8).c = 0;
  (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->weight_data_packed).data = (void *)0x0;
  (this->weight_data_packed).refcount = (int *)0x0;
  (this->weight_data_packed).elemsize = 0;
  (this->weight_data_packed).elempack = 0;
  (this->weight_data_packed).cstep = 0;
  (this->weight_data_int8).data = (void *)0x0;
  (this->weight_data_int8).refcount = (int *)0x0;
  (this->weight_data_int8).elemsize = 0;
  (this->weight_data_int8).elempack = 0;
  this->field_0xc3 = 1;
  this->activation = (Layer *)0x0;
  return;
}

Assistant:

ConvolutionDepthWise_x86::ConvolutionDepthWise_x86()
{
#if __SSE2__
    support_packing = true;
#if __AVX2__
    support_weight_fp16_storage = true;
#endif
#endif // __SSE2__
    activation = 0;
}